

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O0

void Nwk_ManDeleteNode(Nwk_Obj_t *pObj)

{
  Vec_Ptr_t *vNodes_00;
  int iVar1;
  Nwk_Obj_t *pFanin;
  uint uVar2;
  int local_24;
  int i;
  Nwk_Obj_t *pTemp;
  Vec_Ptr_t *vNodes;
  Nwk_Obj_t *pObj_local;
  
  vNodes_00 = pObj->pMan->vTemp;
  iVar1 = Nwk_ObjFanoutNum(pObj);
  if (iVar1 != 0) {
    __assert_fail("Nwk_ObjFanoutNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkObj.c"
                  ,0xa0,"void Nwk_ManDeleteNode(Nwk_Obj_t *)");
  }
  Nwk_ObjCollectFanins(pObj,vNodes_00);
  for (local_24 = 0; iVar1 = Vec_PtrSize(vNodes_00), local_24 < iVar1; local_24 = local_24 + 1) {
    pFanin = (Nwk_Obj_t *)Vec_PtrEntry(vNodes_00,local_24);
    Nwk_ObjDeleteFanin(pObj,pFanin);
  }
  Vec_PtrWriteEntry(pObj->pMan->vObjs,pObj->Id,(void *)0x0);
  uVar2 = *(uint *)&pObj->field_0x20 & 7;
  pObj->pMan->nObjs[uVar2] = pObj->pMan->nObjs[uVar2] + -1;
  memset(pObj,0,0x50);
  pObj->Id = -1;
  return;
}

Assistant:

void Nwk_ManDeleteNode( Nwk_Obj_t * pObj )
{
    Vec_Ptr_t * vNodes = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    int i;
    assert( Nwk_ObjFanoutNum(pObj) == 0 );
    // delete fanins
    Nwk_ObjCollectFanins( pObj, vNodes );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pTemp, i )
        Nwk_ObjDeleteFanin( pObj, pTemp );
    // remove from the list of objects
    Vec_PtrWriteEntry( pObj->pMan->vObjs, pObj->Id, NULL );
    pObj->pMan->nObjs[pObj->Type]--;
    memset( pObj, 0, sizeof(Nwk_Obj_t) );
    pObj->Id = -1;
}